

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_> *
__thiscall
Catch::Clara::Parser::getHelpColumns
          (vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
           *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  __normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
  local_78;
  const_iterator local_70;
  undefined1 local_58 [8];
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  childCols;
  Opt *o;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_> *__range2;
  Parser *this_local;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  *cols;
  
  std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  ::vector(__return_storage_ptr__);
  __end2 = std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::begin
                     (&this->m_options);
  o = (Opt *)std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::end
                       (&this->m_options);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
                                     *)&o), bVar1) {
    childCols.
    super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
                  ::operator*(&__end2);
    Opt::getHelpColumns((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                         *)local_58,
                        (Opt *)childCols.
                               super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_78._M_current =
         (HelpColumns *)
         std::
         vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<Catch::Clara::Detail::HelpColumns_const*,std::vector<Catch::Clara::Detail::HelpColumns,std::allocator<Catch::Clara::Detail::HelpColumns>>>
    ::__normal_iterator<Catch::Clara::Detail::HelpColumns*>
              ((__normal_iterator<Catch::Clara::Detail::HelpColumns_const*,std::vector<Catch::Clara::Detail::HelpColumns,std::allocator<Catch::Clara::Detail::HelpColumns>>>
                *)&local_70,&local_78);
    __first = std::
              vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
              ::begin((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                       *)local_58);
    __last = std::
             vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
             ::end((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                    *)local_58);
    std::vector<Catch::Clara::Detail::HelpColumns,std::allocator<Catch::Clara::Detail::HelpColumns>>
    ::
    insert<__gnu_cxx::__normal_iterator<Catch::Clara::Detail::HelpColumns*,std::vector<Catch::Clara::Detail::HelpColumns,std::allocator<Catch::Clara::Detail::HelpColumns>>>,void>
              ((vector<Catch::Clara::Detail::HelpColumns,std::allocator<Catch::Clara::Detail::HelpColumns>>
                *)__return_storage_ptr__,local_70,
               (__normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
                )__first._M_current,
               (__normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
                )__last._M_current);
    std::
    vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>::
    ~vector((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
             *)local_58);
    __gnu_cxx::
    __normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Detail::HelpColumns> Parser::getHelpColumns() const {
            std::vector<Detail::HelpColumns> cols;
            for ( auto const& o : m_options ) {
                auto childCols = o.getHelpColumns();
                cols.insert( cols.end(), childCols.begin(), childCols.end() );
            }
            return cols;
        }